

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.h
# Opt level: O0

void __thiscall TPZEquationFilter::Filter(TPZEquationFilter *this,TPZVec<long> *dest)

{
  long lVar1;
  int64_t iVar2;
  long *plVar3;
  TPZVec<long> *in_RSI;
  long in_RDI;
  int64_t i;
  int64_t numeq;
  int64_t count;
  long local_28;
  long local_18;
  
  iVar2 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0x38));
  if (iVar2 != 0) {
    local_18 = 0;
    iVar2 = TPZVec<long>::size(in_RSI);
    for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
      plVar3 = TPZVec<long>::operator[](in_RSI,local_28);
      plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x38),*plVar3);
      if (*plVar3 != -1) {
        plVar3 = TPZVec<long>::operator[](in_RSI,local_28);
        plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x38),*plVar3);
        lVar1 = *plVar3;
        plVar3 = TPZVec<long>::operator[](in_RSI,local_18);
        *plVar3 = lVar1;
        local_18 = local_18 + 1;
      }
    }
    (*in_RSI->_vptr_TPZVec[3])(in_RSI,local_18);
  }
  return;
}

Assistant:

void Filter(TPZVec<int64_t> &dest) const
    {
        if (fDestIndices.size() == 0) {
            return;
        }
        else{
            int64_t count = 0;
            int64_t numeq = dest.size();
            for (int64_t i=0; i<numeq; i++) {
                if (fDestIndices[dest[i]] != -1) {
                    dest[count] = fDestIndices[dest[i]];
                    count++;
                }
            }
            dest.Resize(count);
        }
    }